

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C_matrix.h
# Opt level: O0

C_matrix<double> * __thiscall
C_matrix<double>::operator*
          (C_matrix<double> *__return_storage_ptr__,C_matrix<double> *this,double *x)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  ushort local_26;
  ushort local_24;
  unsigned_short j;
  unsigned_short i;
  double *x_local;
  C_matrix<double> *this_local;
  C_matrix<double> *B;
  
  C_matrix(__return_storage_ptr__,this->m_L,this->m_C);
  for (local_24 = 0; (int)(uint)local_24 < this->m_L; local_24 = local_24 + 1) {
    for (local_26 = 0; (int)(uint)local_26 < this->m_C; local_26 = local_26 + 1) {
      pdVar4 = this->m_A;
      iVar3 = getIndex(this,(uint)local_24,(uint)local_26);
      dVar1 = pdVar4[iVar3];
      dVar2 = *x;
      pdVar4 = operator()(__return_storage_ptr__,local_24,local_26);
      *pdVar4 = dVar1 * dVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

C_matrix<dataType> C_matrix<dataType>::operator* (const dataType& x)
{
    C_matrix B(m_L,m_C);
    for(unsigned short i=0 ; i<this->m_L ; i++)
    {
        for(unsigned short j=0 ; j<this->m_C ; j++)
        {
            B(i,j) = m_A[getIndex(i,j)]*x;
        }
    }
    return B;
}